

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O2

void __thiscall LiteScript::Namer::LoadIDs(Namer *this,istream *stream)

{
  Memory *pMVar1;
  uint uVar2;
  uint id;
  Object *pOVar3;
  bool bVar4;
  Variable local_60;
  Nullable<LiteScript::Variable> local_50;
  
  pOVar3 = Variable::operator->(&this->global);
  pMVar1 = pOVar3->memory;
  uVar2 = IStreamer::Read<unsigned_int>(stream);
  Memory::GetVariable(&local_50,pMVar1,uVar2);
  Nullable<LiteScript::Variable>::operator=(&this->current,&local_50);
  Nullable<LiteScript::Variable>::Nullify(&local_50);
  uVar2 = IStreamer::Read<unsigned_int>(stream);
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    pOVar3 = Variable::operator->(&this->global);
    pMVar1 = pOVar3->memory;
    id = IStreamer::Read<unsigned_int>(stream);
    Memory::GetVariable(&local_50,pMVar1,id);
    Variable::Variable(&local_60,(Variable *)&local_50);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&this->heap,&local_60);
    Variable::~Variable(&local_60);
    Nullable<LiteScript::Variable>::Nullify(&local_50);
  }
  return;
}

Assistant:

void LiteScript::Namer::LoadIDs(std::istream &stream) {
    this->current = this->global->memory.GetVariable(IStreamer::Read<unsigned int>(stream));
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        this->heap.push_back(this->global->memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
}